

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O1

void __thiscall
cppcms::impl::tcp_cache_service::session::on_header_in(session *this,error_code *e,size_t param_2)

{
  pointer pcVar1;
  char *p;
  mutable_buffer tmp;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_60;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> local_58;
  __shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2> local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  buffer_impl<char_*> local_40;
  
  if (e->_M_value != 0) {
    handle_error(this,e);
    return;
  }
  pcVar1 = (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = pcVar1;
  }
  std::vector<char,_std::allocator<char>_>::resize(&this->data_in_,(ulong)(this->hin_).size);
  if ((this->hin_).size != 0) {
    p = (this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start;
    local_40.size_ = 0;
    local_40.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_40.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_40.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    booster::aio::buffer_impl<char_*>::add
              (&local_40,p,
               (long)(this->data_in_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)p);
    std::__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<cppcms::impl::tcp_cache_service::session,void>
              (local_50,(__weak_ptr<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2>
                         *)this);
    mfunc_to_io_handler<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
              ((offset_in_session_to_subr)&local_60,
               (shared_ptr<cppcms::impl::tcp_cache_service::session> *)on_data_in);
    local_58.p_ = local_60.p_;
    if (local_60.p_ != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
      booster::atomic_counter::inc();
    }
    booster::aio::stream_socket::async_read((mutable_buffer *)&this->socket_,(callback *)&local_40);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_58);
    booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
    ~intrusive_ptr(&local_60);
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (local_40.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  on_data_in(this,e,0);
  return;
}

Assistant:

void on_header_in(booster::system::error_code const &e,size_t)
	{
		if(e) { handle_error(e); return; }
		data_in_.clear();
		data_in_.resize(hin_.size);
		if(hin_.size > 0) {
			socket_.async_read(io::buffer(data_in_),
				mfunc_to_io_handler(&session::on_data_in,shared_from_this()));
		}
		else {
			on_data_in(e,0);
		}
	}